

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

void __thiscall
CLPIStreamInfo::composeStreamCodingInfo(CLPIStreamInfo *this,BitStreamWriter *writer)

{
  uint uVar1;
  StreamType stream_coding_type;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint value;
  uint uVar10;
  int iVar11;
  long lVar12;
  int local_48;
  
  puVar2 = (writer->super_BitStream).m_buffer;
  puVar3 = (writer->super_BitStream).m_initBuffer;
  uVar1 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,8,0);
  puVar4 = (writer->super_BitStream).m_buffer;
  puVar5 = (writer->super_BitStream).m_initBuffer;
  uVar9 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,8,(this->super_M2TSStreamInfo).stream_coding_type);
  stream_coding_type = (this->super_M2TSStreamInfo).stream_coding_type;
  bVar6 = isVideoStreamType(stream_coding_type);
  if (bVar6) {
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).video_format);
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).frame_rate_index);
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).aspect_ratio_index);
    BitStreamWriter::putBits(writer,2,0);
    BitStreamWriter::putBits(writer,1,0);
    BitStreamWriter::putBits(writer,1,0);
    uVar10 = (this->super_M2TSStreamInfo).HDR;
    uVar8 = 0x22;
    if (uVar10 != 4) {
      uVar8 = 0;
    }
    value = 0x12;
    if ((uVar10 & 0x12) == 0) {
      value = uVar8;
    }
    BitStreamWriter::putBits(writer,8,value);
    uVar10 = (uint)((this->super_M2TSStreamInfo).HDR == 0x10) << 7;
LAB_001de37b:
    BitStreamWriter::putBits(writer,8,uVar10);
  }
  else {
    bVar6 = isAudioStreamType(stream_coding_type);
    if (bVar6) {
      BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).audio_presentation_type);
      BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).sampling_frequency_index)
      ;
      lVar12 = -3;
      do {
        BitStreamWriter::putBits
                  (writer,8,(int)(this->super_M2TSStreamInfo).language_code[lVar12 + 3]);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0);
    }
    else {
      if (stream_coding_type - SUB_PGS < 2) {
        lVar12 = -3;
        do {
          BitStreamWriter::putBits
                    (writer,8,(int)(this->super_M2TSStreamInfo).language_code[lVar12 + 3]);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0);
        uVar10 = 0;
        goto LAB_001de37b;
      }
      if (stream_coding_type != SUB_TGS) goto LAB_001de3f4;
      BitStreamWriter::putBits(writer,8,(uint)(this->super_M2TSStreamInfo).character_code);
      lVar12 = -3;
      do {
        BitStreamWriter::putBits
                  (writer,8,(int)(this->super_M2TSStreamInfo).language_code[lVar12 + 3]);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0);
    }
  }
  composeISRC(writer);
  BitStreamWriter::putBits(writer,0x20,0);
LAB_001de3f4:
  local_48 = (int)puVar5;
  local_48 = (int)puVar4 - local_48;
  uVar10 = uVar9 + local_48 * 8;
  iVar11 = (int)puVar2 - (int)puVar3;
  uVar9 = uVar9 + 7 + local_48 * 8;
  if (-1 < (int)uVar10) {
    uVar9 = uVar10;
  }
  iVar7 = uVar1 + iVar11 * 8;
  iVar11 = uVar1 + iVar11 * 8 + 7;
  if (-1 < iVar7) {
    iVar11 = iVar7;
  }
  iVar7 = *(int *)&(writer->super_BitStream).m_buffer -
          *(int *)&(writer->super_BitStream).m_initBuffer;
  uVar1 = writer->m_bitWrited + iVar7 * 8;
  uVar10 = writer->m_bitWrited + iVar7 * 8 + 7;
  if (-1 < (int)uVar1) {
    uVar10 = uVar1;
  }
  *(char *)((long)puVar3 + (long)(iVar11 >> 3)) = (char)(uVar10 >> 3) - (char)(uVar9 >> 3);
  return;
}

Assistant:

void CLPIStreamInfo::composeStreamCodingInfo(BitStreamWriter& writer) const
{
    uint8_t* lengthPos = writer.getBuffer() + writer.getBitsCount() / 8;
    writer.putBits(8, 0);  // length
    const unsigned beforeCount = writer.getBitsCount() / 8;

    writer.putBits(8, static_cast<int>(stream_coding_type));

    if (isVideoStreamType(stream_coding_type))
    {
        writer.putBits(4, video_format);
        writer.putBits(4, frame_rate_index);
        writer.putBits(4, aspect_ratio_index);
        writer.putBits(2, 0);  // reserved_for_future_use
        writer.putBit(0);      // cc_flag
        writer.putBit(0);      // reserved
        if (HDR & 18)
            writer.putBits(8, 0x12);  // HDR10 or HDR10plus
        else if (HDR == 4)
            writer.putBits(8, 0x22);  // DV
        else
            writer.putBits(8, 0);
        if (HDR == 16)
            writer.putBits(8, 0x80);  // HDR10plus
        else
            writer.putBits(8, 0);
        composeISRC(writer);
        writer.putBits(32, 0);  // reserved_for_future_use
    }
    else if (isAudioStreamType(stream_coding_type))
    {
        writer.putBits(4, audio_presentation_type);
        writer.putBits(4, sampling_frequency_index);
        writeString(language_code, writer, 3);
        composeISRC(writer);
        writer.putBits(32, 0);  // reserved_for_future_use
    }
    else if (stream_coding_type == StreamType::SUB_PGS || stream_coding_type == StreamType::SUB_IGS)
    {
        writeString(language_code, writer, 3);
        writer.putBits(8, 0);  // reserved_for_future_use
        composeISRC(writer);
        writer.putBits(32, 0);  // reserved_for_future_use
    }
    else if (stream_coding_type == StreamType::SUB_TGS)
    {
        // Text subtitle stream
        writer.putBits(8, character_code);
        writeString(language_code, writer, 3);
        composeISRC(writer);
        writer.putBits(32, 0);  // reserved_for_future_use
    }
    *lengthPos = static_cast<uint8_t>(writer.getBitsCount() / 8 - beforeCount);
}